

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputFlateDecodeStream.cpp
# Opt level: O0

LongBufferSizeType __thiscall
OutputFlateDecodeStream::Write
          (OutputFlateDecodeStream *this,Byte *inBuffer,LongBufferSizeType inSize)

{
  int iVar1;
  undefined4 extraout_var;
  LongBufferSizeType inSize_local;
  Byte *inBuffer_local;
  OutputFlateDecodeStream *this_local;
  
  if ((this->mCurrentlyEncoding & 1U) == 0) {
    if (this->mTargetStream == (IByteWriter *)0x0) {
      this_local = (OutputFlateDecodeStream *)0x0;
    }
    else {
      iVar1 = (*this->mTargetStream->_vptr_IByteWriter[2])(this->mTargetStream,inBuffer,inSize);
      this_local = (OutputFlateDecodeStream *)CONCAT44(extraout_var,iVar1);
    }
  }
  else {
    this_local = (OutputFlateDecodeStream *)DecodeBufferAndWrite(this,inBuffer,inSize);
  }
  return (LongBufferSizeType)this_local;
}

Assistant:

LongBufferSizeType OutputFlateDecodeStream::Write(const IOBasicTypes::Byte* inBuffer,LongBufferSizeType inSize)
{
	if(mCurrentlyEncoding)
		return DecodeBufferAndWrite(inBuffer,inSize);
	else if(mTargetStream)
		return mTargetStream->Write(inBuffer,inSize);
	else
		return 0;
}